

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

quaternion dja::normalize(quaternion *q)

{
  vec4 local_40;
  vec4 local_30;
  quaternion *local_20;
  quaternion *q_local;
  
  local_20 = q;
  vec4::vec4(&local_40,q);
  local_30 = normalize(&local_40);
  quaternion::quaternion((quaternion *)&q_local,&local_30);
  return _q_local;
}

Assistant:

Q normalize(const Q& q) {return Q(normalize(V4(q)));}